

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O2

optional<tinyusdz::Path> * __thiscall
tinyusdz::crate::CrateReader::GetPath
          (optional<tinyusdz::Path> *__return_storage_ptr__,CrateReader *this,Index index)

{
  pointer pPVar1;
  
  pPVar1 = (this->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)index.value <
      (ulong)(((long)(this->_paths).
                     super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pPVar1) / 0xd0)) {
    nonstd::optional_lite::optional<tinyusdz::Path>::optional<const_tinyusdz::Path_&,_0>
              (__return_storage_ptr__,pPVar1 + index.value);
  }
  else {
    __return_storage_ptr__->has_value_ = false;
    memset(&__return_storage_ptr__->contained,0,0xd0);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<Path> CrateReader::GetPath(crate::Index index) const {

  if (index.value < _paths.size()) {
    // ok
  } else {
    return nonstd::nullopt;
  }

  return _paths[index.value];
}